

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::DecimalType::printTo(DecimalType *this,ostream *out)

{
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"DecimalType(",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"scale=",6);
  duckdb_apache::thrift::to_string<int>(&local_40,&this->scale);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"precision=",10);
  duckdb_apache::thrift::to_string<int>(&local_40,&this->precision);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,")",1);
  return;
}

Assistant:

void DecimalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DecimalType(";
  out << "scale=" << to_string(scale);
  out << ", " << "precision=" << to_string(precision);
  out << ")";
}